

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void __thiscall
ftxui::(anonymous_namespace)::
compose(std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>,std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>)
::$_0::~__0(__0 *this)

{
  if (*(code **)(this + 0x30) != (code *)0x0) {
    (**(code **)(this + 0x30))(this + 0x20,this + 0x20,3);
  }
  if (*(code **)(this + 0x10) != (code *)0x0) {
    (**(code **)(this + 0x10))(this,this,3);
  }
  return;
}

Assistant:

Decorator compose(Decorator a, Decorator b) {
  return [a = std::move(a), b = std::move(b)](Element element) {
    return b(a(std::move(element)));
  };
}